

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::computeQuadTexCoord3D
               (vector<float,_std::allocator<float>_> *dst,Vec3 *p0,Vec3 *p1,IVec3 *dirSwz)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pfVar4;
  Vec3 v0;
  Vec3 f3;
  Vec3 f2;
  Vec3 f1;
  Vec3 v3;
  Vec3 v2;
  tcu local_60 [12];
  Vec3 v1;
  tcu local_48 [12];
  Vec3 f0;
  
  f1.m_data[0] = 0.0;
  f1.m_data[1] = 0.0;
  f1.m_data[2] = 0.0;
  iVar1 = dirSwz->m_data[0];
  iVar2 = dirSwz->m_data[1];
  iVar3 = dirSwz->m_data[2];
  f0.m_data[0] = f1.m_data[iVar1];
  f2.m_data[0] = 0.0;
  f2.m_data[1] = 1.0;
  f2.m_data[2] = 0.0;
  f0.m_data[1] = f1.m_data[iVar2];
  f0.m_data[2] = f1.m_data[iVar3];
  f3.m_data[0] = 1.0;
  f3.m_data[1] = 0.0;
  f3.m_data[2] = 0.0;
  f1.m_data[1] = f2.m_data[iVar2];
  f1.m_data[0] = f2.m_data[iVar1];
  f1.m_data[2] = f2.m_data[iVar3];
  v0.m_data[0] = 1.0;
  v0.m_data[1] = 1.0;
  v0.m_data[2] = 0.0;
  f2.m_data[1] = f3.m_data[iVar2];
  f2.m_data[0] = f3.m_data[iVar1];
  f2.m_data[2] = f3.m_data[iVar3];
  f3.m_data[2] = v0.m_data[iVar3];
  f3.m_data[1] = v0.m_data[iVar2];
  f3.m_data[0] = v0.m_data[iVar1];
  tcu::operator-((tcu *)&v2,p1,p0);
  tcu::operator*((tcu *)&v1,(Vector<float,_3> *)&v2,&f0);
  tcu::operator+((tcu *)&v0,p0,(Vector<float,_3> *)&v1);
  tcu::operator-((tcu *)&v3,p1,p0);
  tcu::operator*((tcu *)&v2,(Vector<float,_3> *)&v3,&f1);
  tcu::operator+((tcu *)&v1,p0,(Vector<float,_3> *)&v2);
  tcu::operator-(local_60,p1,p0);
  tcu::operator*((tcu *)&v3,(Vector<float,_3> *)local_60,&f2);
  tcu::operator+((tcu *)&v2,p0,(Vector<float,_3> *)&v3);
  tcu::operator-(local_48,p1,p0);
  tcu::operator*(local_60,(Vector<float,_3> *)local_48,&f3);
  tcu::operator+((tcu *)&v3,p0,(Vector<float,_3> *)local_60);
  std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
  pfVar4 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *pfVar4 = v0.m_data[0];
  pfVar4[1] = v0.m_data[1];
  pfVar4[2] = v0.m_data[2];
  pfVar4[3] = v1.m_data[0];
  pfVar4[4] = v1.m_data[1];
  pfVar4[5] = v1.m_data[2];
  pfVar4[6] = v2.m_data[0];
  pfVar4[7] = v2.m_data[1];
  pfVar4[8] = v2.m_data[2];
  pfVar4[9] = v3.m_data[0];
  pfVar4[10] = v3.m_data[1];
  pfVar4[0xb] = v3.m_data[2];
  return;
}

Assistant:

void computeQuadTexCoord3D (std::vector<float>& dst, const tcu::Vec3& p0, const tcu::Vec3& p1, const tcu::IVec3& dirSwz)
{
	tcu::Vec3 f0 = tcu::Vec3(0.0f, 0.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f1 = tcu::Vec3(0.0f, 1.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f2 = tcu::Vec3(1.0f, 0.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f3 = tcu::Vec3(1.0f, 1.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);

	tcu::Vec3 v0 = p0 + (p1-p0)*f0;
	tcu::Vec3 v1 = p0 + (p1-p0)*f1;
	tcu::Vec3 v2 = p0 + (p1-p0)*f2;
	tcu::Vec3 v3 = p0 + (p1-p0)*f3;

	dst.resize(4*3);

	dst[0] = v0.x(); dst[ 1] = v0.y(); dst[ 2] = v0.z();
	dst[3] = v1.x(); dst[ 4] = v1.y(); dst[ 5] = v1.z();
	dst[6] = v2.x(); dst[ 7] = v2.y(); dst[ 8] = v2.z();
	dst[9] = v3.x(); dst[10] = v3.y(); dst[11] = v3.z();
}